

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_multi.cc
# Opt level: O0

void save_load_tree(log_multi *b,io_buf *model_file,bool read,bool text)

{
  ulong uVar1;
  size_t sVar2;
  ostream *poVar3;
  io_buf *piVar4;
  node_pred *pnVar5;
  byte in_CL;
  uint uVar6;
  byte in_DL;
  long in_RSI;
  uint *in_RDI;
  node_pred *p;
  size_t k_1;
  uint32_t k;
  uint32_t temp_1;
  node *n;
  size_t j_1;
  uint32_t j;
  uint32_t temp;
  stringstream msg;
  undefined4 in_stack_fffffffffffffc5c;
  v_array<node> *in_stack_fffffffffffffc60;
  ostream *in_stack_fffffffffffffc68;
  undefined1 text_00;
  stringstream *in_stack_fffffffffffffc70;
  ostream *in_stack_fffffffffffffc78;
  undefined1 read_00;
  ostream *in_stack_fffffffffffffc80;
  ostream *in_stack_fffffffffffffc88;
  node_pred *in_stack_fffffffffffffc90;
  io_buf *in_stack_fffffffffffffc98;
  io_buf *local_248;
  node_pred local_240;
  uint local_228;
  uint local_224;
  node *local_220;
  ulong local_218;
  uint local_1b4;
  uint local_1b0;
  stringstream local_1a0 [16];
  ostream local_190;
  byte local_12;
  byte local_11;
  uint *local_8;
  
  local_11 = in_DL & 1;
  local_12 = in_CL & 1;
  local_8 = in_RDI;
  sVar2 = v_array<int>::size((v_array<int> *)(in_RSI + 0x30));
  if (sVar2 != 0) {
    std::__cxx11::stringstream::stringstream(local_1a0);
    poVar3 = std::operator<<(&local_190,"k = ");
    std::ostream::operator<<(poVar3,*local_8);
    bin_text_read_write_fixed
              (in_stack_fffffffffffffc98,(char *)in_stack_fffffffffffffc90,
               (size_t)in_stack_fffffffffffffc88,(char *)in_stack_fffffffffffffc80,
               SUB81((ulong)in_stack_fffffffffffffc78 >> 0x38,0),in_stack_fffffffffffffc70,
               SUB81((ulong)in_stack_fffffffffffffc68 >> 0x38,0));
    poVar3 = std::operator<<(&local_190,"nodes = ");
    sVar2 = v_array<node>::size((v_array<node> *)(local_8 + 2));
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,sVar2);
    std::operator<<(poVar3," ");
    sVar2 = v_array<node>::size((v_array<node> *)(local_8 + 2));
    local_1b0 = (uint)sVar2;
    uVar6 = local_12 & 1;
    bin_text_read_write_fixed
              (in_stack_fffffffffffffc98,(char *)in_stack_fffffffffffffc90,
               (size_t)in_stack_fffffffffffffc88,(char *)in_stack_fffffffffffffc80,
               SUB81((ulong)in_stack_fffffffffffffc78 >> 0x38,0),in_stack_fffffffffffffc70,
               SUB81((ulong)in_stack_fffffffffffffc68 >> 0x38,0));
    if ((local_11 & 1) != 0) {
      for (local_1b4 = 1; local_1b4 < local_1b0; local_1b4 = local_1b4 + 1) {
        init_node();
        v_array<node>::push_back
                  (in_stack_fffffffffffffc60,(node *)CONCAT44(in_stack_fffffffffffffc5c,uVar6));
      }
    }
    poVar3 = std::operator<<(&local_190,"max predictors = ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,*(ulong *)(local_8 + 10));
    std::operator<<(poVar3," ");
    bin_text_read_write_fixed
              (in_stack_fffffffffffffc98,(char *)in_stack_fffffffffffffc90,
               (size_t)in_stack_fffffffffffffc88,(char *)in_stack_fffffffffffffc80,
               SUB81((ulong)in_stack_fffffffffffffc78 >> 0x38,0),in_stack_fffffffffffffc70,
               SUB81((ulong)in_stack_fffffffffffffc68 >> 0x38,0));
    poVar3 = std::operator<<(&local_190,"predictors_used = ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,*(ulong *)(local_8 + 0xc));
    std::operator<<(poVar3," ");
    bin_text_read_write_fixed
              (in_stack_fffffffffffffc98,(char *)in_stack_fffffffffffffc90,
               (size_t)in_stack_fffffffffffffc88,(char *)in_stack_fffffffffffffc80,
               SUB81((ulong)in_stack_fffffffffffffc78 >> 0x38,0),in_stack_fffffffffffffc70,
               SUB81((ulong)in_stack_fffffffffffffc68 >> 0x38,0));
    poVar3 = std::operator<<(&local_190,"progress = ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,(bool)((byte)local_8[0xe] & 1));
    std::operator<<(poVar3," ");
    bin_text_read_write_fixed
              (in_stack_fffffffffffffc98,(char *)in_stack_fffffffffffffc90,
               (size_t)in_stack_fffffffffffffc88,(char *)in_stack_fffffffffffffc80,
               SUB81((ulong)in_stack_fffffffffffffc78 >> 0x38,0),in_stack_fffffffffffffc70,
               SUB81((ulong)in_stack_fffffffffffffc68 >> 0x38,0));
    poVar3 = std::operator<<(&local_190,"swap_resist = ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_8[0xf]);
    std::operator<<(poVar3,"\n");
    bin_text_read_write_fixed
              (in_stack_fffffffffffffc98,(char *)in_stack_fffffffffffffc90,
               (size_t)in_stack_fffffffffffffc88,(char *)in_stack_fffffffffffffc80,
               SUB81((ulong)in_stack_fffffffffffffc78 >> 0x38,0),in_stack_fffffffffffffc70,
               SUB81((ulong)in_stack_fffffffffffffc68 >> 0x38,0));
    for (local_218 = 0; uVar1 = local_218,
        sVar2 = v_array<node>::size((v_array<node> *)(local_8 + 2)), uVar1 < sVar2;
        local_218 = local_218 + 1) {
      local_220 = v_array<node>::operator[]((v_array<node> *)(local_8 + 2),local_218);
      poVar3 = std::operator<<(&local_190," parent = ");
      std::ostream::operator<<(poVar3,local_220->parent);
      bin_text_read_write_fixed
                (in_stack_fffffffffffffc98,(char *)in_stack_fffffffffffffc90,
                 (size_t)in_stack_fffffffffffffc88,(char *)in_stack_fffffffffffffc80,
                 SUB81((ulong)in_stack_fffffffffffffc78 >> 0x38,0),in_stack_fffffffffffffc70,
                 SUB81((ulong)in_stack_fffffffffffffc68 >> 0x38,0));
      sVar2 = v_array<node_pred>::size(&local_220->preds);
      local_224 = (uint)sVar2;
      poVar3 = std::operator<<(&local_190," preds = ");
      std::ostream::operator<<(poVar3,local_224);
      uVar6 = local_12 & 1;
      bin_text_read_write_fixed
                (in_stack_fffffffffffffc98,(char *)in_stack_fffffffffffffc90,
                 (size_t)in_stack_fffffffffffffc88,(char *)in_stack_fffffffffffffc80,
                 SUB81((ulong)in_stack_fffffffffffffc78 >> 0x38,0),in_stack_fffffffffffffc70,
                 SUB81((ulong)in_stack_fffffffffffffc68 >> 0x38,0));
      if ((local_11 & 1) != 0) {
        for (local_228 = 0; local_228 < local_224; local_228 = local_228 + 1) {
          node_pred::node_pred(&local_240,1);
          v_array<node_pred>::push_back
                    ((v_array<node_pred> *)in_stack_fffffffffffffc60,
                     (node_pred *)CONCAT44(in_stack_fffffffffffffc5c,uVar6));
        }
      }
      poVar3 = std::operator<<(&local_190," min_count = ");
      std::ostream::operator<<(poVar3,local_220->min_count);
      bin_text_read_write_fixed
                (in_stack_fffffffffffffc98,(char *)in_stack_fffffffffffffc90,
                 (size_t)in_stack_fffffffffffffc88,(char *)in_stack_fffffffffffffc80,
                 SUB81((ulong)in_stack_fffffffffffffc78 >> 0x38,0),in_stack_fffffffffffffc70,
                 SUB81((ulong)in_stack_fffffffffffffc68 >> 0x38,0));
      poVar3 = std::operator<<(&local_190," internal = ");
      std::ostream::operator<<(poVar3,(bool)(local_220->internal & 1));
      bin_text_read_write_fixed
                (in_stack_fffffffffffffc98,(char *)in_stack_fffffffffffffc90,
                 (size_t)in_stack_fffffffffffffc88,(char *)in_stack_fffffffffffffc80,
                 SUB81((ulong)in_stack_fffffffffffffc78 >> 0x38,0),in_stack_fffffffffffffc70,
                 SUB81((ulong)in_stack_fffffffffffffc68 >> 0x38,0));
      if ((local_220->internal & 1U) == 0) {
        poVar3 = std::operator<<(&local_190," max_count = ");
        std::ostream::operator<<(poVar3,local_220->max_count);
        bin_text_read_write_fixed
                  (in_stack_fffffffffffffc98,(char *)in_stack_fffffffffffffc90,
                   (size_t)in_stack_fffffffffffffc88,(char *)in_stack_fffffffffffffc80,
                   SUB81((ulong)in_stack_fffffffffffffc78 >> 0x38,0),in_stack_fffffffffffffc70,
                   SUB81((ulong)in_stack_fffffffffffffc68 >> 0x38,0));
        poVar3 = std::operator<<(&local_190," max_count_label = ");
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_220->max_count_label);
        std::operator<<(poVar3,"\n");
        bin_text_read_write_fixed
                  (in_stack_fffffffffffffc98,(char *)in_stack_fffffffffffffc90,
                   (size_t)in_stack_fffffffffffffc88,(char *)in_stack_fffffffffffffc80,
                   SUB81((ulong)in_stack_fffffffffffffc78 >> 0x38,0),in_stack_fffffffffffffc70,
                   SUB81((ulong)in_stack_fffffffffffffc68 >> 0x38,0));
      }
      else {
        poVar3 = std::operator<<(&local_190," base_predictor = ");
        std::ostream::operator<<(poVar3,local_220->base_predictor);
        bin_text_read_write_fixed
                  (in_stack_fffffffffffffc98,(char *)in_stack_fffffffffffffc90,
                   (size_t)in_stack_fffffffffffffc88,(char *)in_stack_fffffffffffffc80,
                   SUB81((ulong)in_stack_fffffffffffffc78 >> 0x38,0),in_stack_fffffffffffffc70,
                   SUB81((ulong)in_stack_fffffffffffffc68 >> 0x38,0));
        poVar3 = std::operator<<(&local_190," left = ");
        std::ostream::operator<<(poVar3,local_220->left);
        bin_text_read_write_fixed
                  (in_stack_fffffffffffffc98,(char *)in_stack_fffffffffffffc90,
                   (size_t)in_stack_fffffffffffffc88,(char *)in_stack_fffffffffffffc80,
                   SUB81((ulong)in_stack_fffffffffffffc78 >> 0x38,0),in_stack_fffffffffffffc70,
                   SUB81((ulong)in_stack_fffffffffffffc68 >> 0x38,0));
        poVar3 = std::operator<<(&local_190," right = ");
        std::ostream::operator<<(poVar3,local_220->right);
        bin_text_read_write_fixed
                  (in_stack_fffffffffffffc98,(char *)in_stack_fffffffffffffc90,
                   (size_t)in_stack_fffffffffffffc88,(char *)in_stack_fffffffffffffc80,
                   SUB81((ulong)in_stack_fffffffffffffc78 >> 0x38,0),in_stack_fffffffffffffc70,
                   SUB81((ulong)in_stack_fffffffffffffc68 >> 0x38,0));
        poVar3 = std::operator<<(&local_190," norm_Eh = ");
        std::ostream::operator<<(poVar3,local_220->norm_Eh);
        bin_text_read_write_fixed
                  (in_stack_fffffffffffffc98,(char *)in_stack_fffffffffffffc90,
                   (size_t)in_stack_fffffffffffffc88,(char *)in_stack_fffffffffffffc80,
                   SUB81((ulong)in_stack_fffffffffffffc78 >> 0x38,0),in_stack_fffffffffffffc70,
                   SUB81((ulong)in_stack_fffffffffffffc68 >> 0x38,0));
        poVar3 = std::operator<<(&local_190," Eh = ");
        std::ostream::operator<<(poVar3,local_220->Eh);
        bin_text_read_write_fixed
                  (in_stack_fffffffffffffc98,(char *)in_stack_fffffffffffffc90,
                   (size_t)in_stack_fffffffffffffc88,(char *)in_stack_fffffffffffffc80,
                   SUB81((ulong)in_stack_fffffffffffffc78 >> 0x38,0),in_stack_fffffffffffffc70,
                   SUB81((ulong)in_stack_fffffffffffffc68 >> 0x38,0));
        poVar3 = std::operator<<(&local_190," n = ");
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_220->n);
        std::operator<<(poVar3,"\n");
        bin_text_read_write_fixed
                  (in_stack_fffffffffffffc98,(char *)in_stack_fffffffffffffc90,
                   (size_t)in_stack_fffffffffffffc88,(char *)in_stack_fffffffffffffc80,
                   SUB81((ulong)in_stack_fffffffffffffc78 >> 0x38,0),in_stack_fffffffffffffc70,
                   SUB81((ulong)in_stack_fffffffffffffc68 >> 0x38,0));
      }
      local_248 = (io_buf *)0x0;
      while( true ) {
        in_stack_fffffffffffffc98 = local_248;
        piVar4 = (io_buf *)v_array<node_pred>::size(&local_220->preds);
        text_00 = (undefined1)((ulong)in_stack_fffffffffffffc68 >> 0x38);
        read_00 = (undefined1)((ulong)in_stack_fffffffffffffc78 >> 0x38);
        if (piVar4 <= in_stack_fffffffffffffc98) break;
        pnVar5 = v_array<node_pred>::operator[](&local_220->preds,(size_t)local_248);
        in_stack_fffffffffffffc90 = pnVar5;
        in_stack_fffffffffffffc88 = std::operator<<(&local_190,"  Ehk = ");
        std::ostream::operator<<(in_stack_fffffffffffffc88,pnVar5->Ehk);
        bin_text_read_write_fixed
                  (in_stack_fffffffffffffc98,(char *)in_stack_fffffffffffffc90,
                   (size_t)in_stack_fffffffffffffc88,(char *)in_stack_fffffffffffffc80,(bool)read_00
                   ,in_stack_fffffffffffffc70,(bool)text_00);
        in_stack_fffffffffffffc80 = std::operator<<(&local_190," norm_Ehk = ");
        std::ostream::operator<<(in_stack_fffffffffffffc80,pnVar5->norm_Ehk);
        bin_text_read_write_fixed
                  (in_stack_fffffffffffffc98,(char *)in_stack_fffffffffffffc90,
                   (size_t)in_stack_fffffffffffffc88,(char *)in_stack_fffffffffffffc80,(bool)read_00
                   ,in_stack_fffffffffffffc70,(bool)text_00);
        in_stack_fffffffffffffc78 = std::operator<<(&local_190," nk = ");
        std::ostream::operator<<(in_stack_fffffffffffffc78,pnVar5->nk);
        bin_text_read_write_fixed
                  (in_stack_fffffffffffffc98,(char *)in_stack_fffffffffffffc90,
                   (size_t)in_stack_fffffffffffffc88,(char *)in_stack_fffffffffffffc80,
                   SUB81((ulong)in_stack_fffffffffffffc78 >> 0x38,0),in_stack_fffffffffffffc70,
                   (bool)text_00);
        in_stack_fffffffffffffc70 = (stringstream *)std::operator<<(&local_190," label = ");
        std::ostream::operator<<(in_stack_fffffffffffffc70,pnVar5->label);
        bin_text_read_write_fixed
                  (in_stack_fffffffffffffc98,(char *)in_stack_fffffffffffffc90,
                   (size_t)in_stack_fffffffffffffc88,(char *)in_stack_fffffffffffffc80,
                   SUB81((ulong)in_stack_fffffffffffffc78 >> 0x38,0),in_stack_fffffffffffffc70,
                   (bool)text_00);
        in_stack_fffffffffffffc68 = std::operator<<(&local_190," label_count = ");
        in_stack_fffffffffffffc60 =
             (v_array<node> *)
             std::ostream::operator<<(in_stack_fffffffffffffc68,pnVar5->label_count);
        std::operator<<((ostream *)in_stack_fffffffffffffc60,"\n");
        bin_text_read_write_fixed
                  (in_stack_fffffffffffffc98,(char *)in_stack_fffffffffffffc90,
                   (size_t)in_stack_fffffffffffffc88,(char *)in_stack_fffffffffffffc80,
                   SUB81((ulong)in_stack_fffffffffffffc78 >> 0x38,0),in_stack_fffffffffffffc70,
                   SUB81((ulong)in_stack_fffffffffffffc68 >> 0x38,0));
        local_248 = (io_buf *)((long)&local_248->_vptr_io_buf + 1);
      }
    }
    std::__cxx11::stringstream::~stringstream(local_1a0);
  }
  return;
}

Assistant:

void save_load_tree(log_multi& b, io_buf& model_file, bool read, bool text)
{
  if (model_file.files.size() > 0)
  {
    stringstream msg;
    msg << "k = " << b.k;
    bin_text_read_write_fixed(model_file, (char*)&b.max_predictors, sizeof(b.k), "", read, msg, text);

    msg << "nodes = " << b.nodes.size() << " ";
    uint32_t temp = (uint32_t)b.nodes.size();
    bin_text_read_write_fixed(model_file, (char*)&temp, sizeof(temp), "", read, msg, text);
    if (read)
      for (uint32_t j = 1; j < temp; j++) b.nodes.push_back(init_node());

    msg << "max predictors = " << b.max_predictors << " ";
    bin_text_read_write_fixed(model_file, (char*)&b.max_predictors, sizeof(b.max_predictors), "", read, msg, text);

    msg << "predictors_used = " << b.predictors_used << " ";
    bin_text_read_write_fixed(model_file, (char*)&b.predictors_used, sizeof(b.predictors_used), "", read, msg, text);

    msg << "progress = " << b.progress << " ";
    bin_text_read_write_fixed(model_file, (char*)&b.progress, sizeof(b.progress), "", read, msg, text);

    msg << "swap_resist = " << b.swap_resist << "\n";
    bin_text_read_write_fixed(model_file, (char*)&b.swap_resist, sizeof(b.swap_resist), "", read, msg, text);

    for (size_t j = 0; j < b.nodes.size(); j++)
    {
      // Need to read or write nodes.
      node& n = b.nodes[j];

      msg << " parent = " << n.parent;
      bin_text_read_write_fixed(model_file, (char*)&n.parent, sizeof(n.parent), "", read, msg, text);

      uint32_t temp = (uint32_t)n.preds.size();

      msg << " preds = " << temp;
      bin_text_read_write_fixed(model_file, (char*)&temp, sizeof(temp), "", read, msg, text);
      if (read)
        for (uint32_t k = 0; k < temp; k++) n.preds.push_back(node_pred(1));

      msg << " min_count = " << n.min_count;
      bin_text_read_write_fixed(model_file, (char*)&n.min_count, sizeof(n.min_count), "", read, msg, text);

      msg << " internal = " << n.internal;
      bin_text_read_write_fixed(model_file, (char*)&n.internal, sizeof(n.internal), "", read, msg, text);

      if (n.internal)
      {
        msg << " base_predictor = " << n.base_predictor;
        bin_text_read_write_fixed(model_file, (char*)&n.base_predictor, sizeof(n.base_predictor), "", read, msg, text);

        msg << " left = " << n.left;
        bin_text_read_write_fixed(model_file, (char*)&n.left, sizeof(n.left), "", read, msg, text);

        msg << " right = " << n.right;
        bin_text_read_write_fixed(model_file, (char*)&n.right, sizeof(n.right), "", read, msg, text);

        msg << " norm_Eh = " << n.norm_Eh;
        bin_text_read_write_fixed(model_file, (char*)&n.norm_Eh, sizeof(n.norm_Eh), "", read, msg, text);

        msg << " Eh = " << n.Eh;
        bin_text_read_write_fixed(model_file, (char*)&n.Eh, sizeof(n.Eh), "", read, msg, text);

        msg << " n = " << n.n << "\n";
        bin_text_read_write_fixed(model_file, (char*)&n.n, sizeof(n.n), "", read, msg, text);
      }
      else
      {
        msg << " max_count = " << n.max_count;
        bin_text_read_write_fixed(model_file, (char*)&n.max_count, sizeof(n.max_count), "", read, msg, text);
        msg << " max_count_label = " << n.max_count_label << "\n";
        bin_text_read_write_fixed(
            model_file, (char*)&n.max_count_label, sizeof(n.max_count_label), "", read, msg, text);
      }

      for (size_t k = 0; k < n.preds.size(); k++)
      {
        node_pred& p = n.preds[k];

        msg << "  Ehk = " << p.Ehk;
        bin_text_read_write_fixed(model_file, (char*)&p.Ehk, sizeof(p.Ehk), "", read, msg, text);

        msg << " norm_Ehk = " << p.norm_Ehk;
        bin_text_read_write_fixed(model_file, (char*)&p.norm_Ehk, sizeof(p.norm_Ehk), "", read, msg, text);

        msg << " nk = " << p.nk;
        bin_text_read_write_fixed(model_file, (char*)&p.nk, sizeof(p.nk), "", read, msg, text);

        msg << " label = " << p.label;
        bin_text_read_write_fixed(model_file, (char*)&p.label, sizeof(p.label), "", read, msg, text);

        msg << " label_count = " << p.label_count << "\n";
        bin_text_read_write_fixed(model_file, (char*)&p.label_count, sizeof(p.label_count), "", read, msg, text);
      }
    }
  }
}